

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O3

size_t __thiscall Memory::HeapInfo::GetSmallHeapBlockCount(HeapInfo *this,bool checkCount)

{
  HeapBucketGroup<SmallAllocationBlockAttributes> *this_00;
  HeapBucketGroup<MediumAllocationBlockAttributes> *this_01;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  RecyclerSweepManager *this_02;
  code *pcVar3;
  long lVar4;
  bool bVar5;
  size_t sVar6;
  size_t sVar7;
  SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *pSVar8;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *pSVar9;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *pSVar10;
  SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar11;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *pSVar12;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *pSVar13;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *pSVar14;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *pSVar15;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar16;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar17;
  undefined4 *puVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  
  lVar19 = 0x78;
  lVar29 = 0;
  do {
    this_00 = (HeapBucketGroup<SmallAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar19);
    sVar6 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this_00,checkCount);
    sVar7 = HeapBucketGroup<SmallAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_00);
    lVar29 = sVar7 + sVar6 + lVar29;
    lVar19 = lVar19 + 0x380;
  } while (lVar19 != 0xa878);
  lVar19 = 0xa878;
  do {
    this_01 = (HeapBucketGroup<MediumAllocationBlockAttributes> *)
              ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
              lVar19);
    sVar6 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetNonEmptyHeapBlockCount
                      (this_01,checkCount);
    sVar7 = HeapBucketGroup<MediumAllocationBlockAttributes>::GetEmptyHeapBlockCount(this_01);
    lVar29 = sVar7 + sVar6 + lVar29;
    lVar19 = lVar19 + 0x380;
  } while (lVar19 != 0x10df8);
  pSVar8 = this->newLeafHeapBlockList;
  if (pSVar8 == (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar19 = 0;
  }
  else {
    lVar20 = 1;
    do {
      lVar19 = lVar20;
      pSVar1 = (pSVar8->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar8 = HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      lVar20 = lVar19 + 1;
    } while (pSVar8 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  pSVar9 = this->newNormalHeapBlockList;
  if (pSVar9 == (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar20 = 0;
  }
  else {
    lVar21 = 1;
    do {
      lVar20 = lVar21;
      pSVar1 = (pSVar9->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar9 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
      lVar21 = lVar20 + 1;
    } while (pSVar9 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  pSVar10 = this->newFinalizableHeapBlockList;
  if (pSVar10 == (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar21 = 0;
  }
  else {
    lVar22 = 1;
    do {
      lVar21 = lVar22;
      pSVar1 = (pSVar10->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar10 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
      lVar22 = lVar21 + 1;
    } while (pSVar10 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  pSVar11 = this->newNormalWithBarrierHeapBlockList;
  if (pSVar11 == (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar22 = 0;
  }
  else {
    lVar23 = 1;
    do {
      lVar22 = lVar23;
      pSVar1 = (pSVar11->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar11 = HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
      lVar23 = lVar22 + 1;
    } while (pSVar11 != (SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0);
  }
  pSVar12 = this->newFinalizableWithBarrierHeapBlockList;
  if (pSVar12 == (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    lVar23 = 0;
  }
  else {
    lVar24 = 1;
    do {
      lVar23 = lVar24;
      pSVar1 = (pSVar12->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
               super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
      if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) break;
      pSVar12 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
      lVar24 = lVar23 + 1;
    } while (pSVar12 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0
            );
  }
  pSVar13 = this->newMediumLeafHeapBlockList;
  if (pSVar13 == (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar24 = 0;
  }
  else {
    lVar25 = 1;
    do {
      lVar24 = lVar25;
      pSVar2 = (pSVar13->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
      if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar13 = HeapBlock::AsLeafBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
      lVar25 = lVar24 + 1;
    } while (pSVar13 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar14 = this->newMediumNormalHeapBlockList;
  if (pSVar14 == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar25 = 0;
  }
  else {
    lVar26 = 1;
    do {
      lVar25 = lVar26;
      pSVar2 = (pSVar14->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
      if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar14 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
      lVar26 = lVar25 + 1;
    } while (pSVar14 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar15 = this->newMediumFinalizableHeapBlockList;
  if (pSVar15 == (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar26 = 0;
  }
  else {
    lVar27 = 1;
    do {
      lVar26 = lVar27;
      pSVar2 = (pSVar15->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar15 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
      lVar27 = lVar26 + 1;
    } while (pSVar15 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar16 = this->newMediumNormalWithBarrierHeapBlockList;
  if (pSVar16 == (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar27 = 0;
  }
  else {
    lVar28 = 1;
    do {
      lVar27 = lVar28;
      pSVar2 = (pSVar16->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar16 = HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
      lVar28 = lVar27 + 1;
    } while (pSVar16 != (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  pSVar17 = this->newMediumFinalizableWithBarrierHeapBlockList;
  if (pSVar17 == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    lVar28 = 0;
  }
  else {
    lVar4 = 1;
    do {
      lVar28 = lVar4;
      pSVar2 = (pSVar17->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
               super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
               super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
      if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) break;
      pSVar17 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
      lVar4 = lVar28 + 1;
    } while (pSVar17 !=
             (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0);
  }
  sVar6 = lVar19 + lVar29 + lVar20 + lVar21 + lVar22 + lVar23 + lVar24 + lVar25 + lVar26 + lVar27 +
          lVar28;
  if ((this->recycler != (Recycler *)0x0) &&
     (this_02 = this->recycler->recyclerSweepManager, this_02 != (RecyclerSweepManager *)0x0)) {
    bVar5 = RecyclerSweepManager::IsBackground(this_02);
    if (bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar18 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                         ,0x68c,"(!this->recycler->recyclerSweepManager->IsBackground())",
                         "!this->recycler->recyclerSweepManager->IsBackground()");
      if (!bVar5) goto LAB_006e1861;
      *puVar18 = 0;
    }
    sVar7 = RecyclerSweepManager::GetPendingMergeNewHeapBlockCount
                      (this->recycler->recyclerSweepManager,this);
    sVar6 = sVar6 + sVar7;
  }
  if ((checkCount) &&
     (sVar6 != this->heapBlockCount[8] + this->heapBlockCount[4] +
               this->heapBlockCount[6] + this->heapBlockCount[2] +
               this->heapBlockCount[7] + this->heapBlockCount[3] +
               this->heapBlockCount[5] + this->heapBlockCount[1] + this->heapBlockCount[9] +
               this->heapBlockCount[10])) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar18 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar18 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapInfo.cpp"
                       ,0x6a6,
                       "(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount)",
                       "!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount");
    if (!bVar5) {
LAB_006e1861:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar18 = 0;
  }
  return sVar6;
}

Assistant:

size_t
HeapInfo::GetSmallHeapBlockCount(bool checkCount) const
{
    size_t currentSmallHeapBlockCount = 0;
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        currentSmallHeapBlockCount += heapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += heapBuckets[i].GetEmptyHeapBlockCount();
    }

#if defined(BUCKETIZE_MEDIUM_ALLOCATIONS) && SMALLBLOCK_MEDIUM_ALLOC
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetNonEmptyHeapBlockCount(checkCount);
        currentSmallHeapBlockCount += mediumHeapBuckets[i].GetEmptyHeapBlockCount();
    }
#endif

#if ENABLE_CONCURRENT_GC
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newRecyclerVisitedHostHeapBlockList);
#endif
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newFinalizableWithBarrierHeapBlockList);
#endif

    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumLeafHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalHeapBlockList);
#ifdef RECYCLER_VISITED_HOST
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumRecyclerVisitedHostHeapBlockList);
#endif
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableHeapBlockList);
#ifdef RECYCLER_WRITE_BARRIER
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumNormalWithBarrierHeapBlockList);
    currentSmallHeapBlockCount += HeapBlockList::Count(this->newMediumFinalizableWithBarrierHeapBlockList);
#endif

    // TODO: Update recycler sweep
    // Recycler can be null if we have OOM in the ctor
    if (this->recycler && this->recycler->recyclerSweepManager != nullptr)
    {
        // This function can't be called in the background
        Assert(!this->recycler->recyclerSweepManager->IsBackground());
        currentSmallHeapBlockCount += this->recycler->recyclerSweepManager->GetPendingMergeNewHeapBlockCount(this);
    }
#endif
#ifdef RECYCLER_SLOW_CHECK_ENABLED
    size_t expectedHeapBlockCount =
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockType]
#ifdef RECYCLER_VISITED_HOST
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallRecyclerVisitedHostBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumRecyclerVisitedHostBlockType]
#endif
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumLeafBlockType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockType];


#ifdef RECYCLER_WRITE_BARRIER
    expectedHeapBlockCount +=
        this->heapBlockCount[HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType]
        + this->heapBlockCount[HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType];

#endif
    Assert(!checkCount || currentSmallHeapBlockCount == expectedHeapBlockCount);
#endif

    return currentSmallHeapBlockCount;
}